

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O0

int big_file_mpi_create_records
              (BigFile *bf,BigRecordType *rtype,char *mode,int Nfile,size_t *fsize,MPI_Comm comm)

{
  int iVar1;
  undefined1 local_98 [8];
  BigBlock block [1];
  int i;
  MPI_Comm comm_local;
  size_t *fsize_local;
  int Nfile_local;
  char *mode_local;
  BigRecordType *rtype_local;
  BigFile *bf_local;
  
  block[0]._76_4_ = 0;
  do {
    if (rtype->nfield <= (ulong)(long)(int)block[0]._76_4_) {
      return 0;
    }
    iVar1 = strcmp(mode,"w+");
    if (iVar1 == 0) {
      iVar1 = _big_file_mpi_create_block
                        (bf,(BigBlock *)local_98,rtype->fields[(int)block[0]._76_4_].name,
                         rtype->fields[(int)block[0]._76_4_].dtype,
                         rtype->fields[(int)block[0]._76_4_].nmemb,Nfile,fsize,comm);
      if (iVar1 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,0x249);
        return -1;
      }
    }
    else {
      iVar1 = strcmp(mode,"a+");
      if (iVar1 != 0) {
        _big_file_raise("Mode string must be `a+` or `w+`, `%s` provided",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,0x254,mode);
        return -1;
      }
      iVar1 = big_file_mpi_open_block
                        (bf,(BigBlock *)local_98,rtype->fields[(int)block[0]._76_4_].name,comm);
      if (iVar1 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,0x24d);
        return -1;
      }
      iVar1 = big_block_mpi_grow((BigBlock *)local_98,Nfile,fsize,comm);
      if (iVar1 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,0x250);
        iVar1 = big_block_mpi_close((BigBlock *)local_98,comm);
        if (iVar1 != 0) {
          _big_file_raise((char *)0x0,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                          ,0x25d);
          return -1;
        }
        return -1;
      }
    }
    iVar1 = big_block_mpi_close((BigBlock *)local_98,comm);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                      ,600);
      return -1;
    }
    block[0]._76_4_ = block[0]._76_4_ + 1;
  } while( true );
}

Assistant:

int
big_file_mpi_create_records(BigFile * bf,
    const BigRecordType * rtype,
    const char * mode,
    int Nfile,
    const size_t fsize[],
    MPI_Comm comm)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigBlock block[1];
        if (0 == strcmp(mode, "w+")) {
            RAISEIF(0 != _big_file_mpi_create_block(bf, block,
                             rtype->fields[i].name,
                             rtype->fields[i].dtype,
                             rtype->fields[i].nmemb,
                             Nfile,
                             fsize,
                             comm),
                ex_open,
                NULL);
        } else if (0 == strcmp(mode, "a+")) {
            RAISEIF(0 != big_file_mpi_open_block(bf, block, rtype->fields[i].name, comm),
                ex_open,
                NULL);
            RAISEIF(0 != big_block_mpi_grow(block, Nfile, fsize, comm),
                ex_grow,
                NULL);
        } else {
            RAISE(ex_open,
                "Mode string must be `a+` or `w+`, `%s` provided",
                mode);
        }
        RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
        continue;
        ex_grow:
            RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
            return -1;
    }
    return 0;
}